

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenFile(DiskHandle *this,PathPtr path)

{
  size_t sVar1;
  int iVar2;
  int code;
  undefined8 *puVar3;
  ReadableFile *extraout_RDX;
  ReadableFile *extraout_RDX_00;
  ReadableFile *extraout_RDX_01;
  ReadableFile *extraout_RDX_02;
  ReadableFile *extraout_RDX_03;
  ReadableFile *pRVar4;
  Disposer *pDVar5;
  char *pcVar6;
  Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_> MVar7;
  OwnFd result;
  OwnFd local_6c;
  String local_68;
  Disposer *local_48;
  PathPtr local_40;
  
  local_40.parts.ptr = (String *)path.parts.size_;
  local_48 = (Disposer *)this;
  while( true ) {
    iVar2 = *(int *)&((path.parts.ptr)->content).ptr;
    PathPtr::toString(&local_68,&local_40,false);
    pcVar6 = "";
    if (local_68.content.size_ != 0) {
      pcVar6 = local_68.content.ptr;
    }
    iVar2 = openat64(iVar2,pcVar6,0x80000);
    sVar1 = local_68.content.size_;
    pcVar6 = local_68.content.ptr;
    pRVar4 = extraout_RDX;
    if (local_68.content.ptr != (char *)0x0) {
      local_68.content.ptr = (char *)0x0;
      local_68.content.size_ = 0;
      (**(local_68.content.disposer)->_vptr_ArrayDisposer)
                (local_68.content.disposer,pcVar6,1,sVar1,sVar1,0);
      pRVar4 = extraout_RDX_00;
    }
    if (-1 < iVar2) break;
    code = _::Debug::getOsErrorNumber(false);
    pRVar4 = extraout_RDX_01;
    if (code != -1) {
LAB_001f9e94:
      if (code == 0) {
        local_68.content.ptr = (char *)CONCAT44(local_68.content.ptr._4_4_,0xffffffff);
        local_6c.fd = iVar2;
        puVar3 = (undefined8 *)operator_new(0x10);
        pDVar5 = local_48;
        *puVar3 = &PTR_getFd_0026fc38;
        *(int *)(puVar3 + 1) = iVar2;
        local_6c.fd = -1;
        *puVar3 = &PTR_getFd_0026f298;
        *(undefined8 **)&local_48->_vptr_Disposer =
             &_::HeapDisposer<kj::(anonymous_namespace)::DiskReadableFile>::instance;
        *(undefined8 **)&local_48[1]._vptr_Disposer = puVar3;
        OwnFd::~OwnFd(&local_6c);
        OwnFd::~OwnFd((OwnFd *)&local_68);
        pRVar4 = extraout_RDX_02;
      }
      else if ((code == 0x14) || (code == 2)) {
        *(undefined8 *)&local_48->_vptr_Disposer = 0;
        *(undefined8 *)&local_48[1]._vptr_Disposer = 0;
        pDVar5 = local_48;
      }
      else {
        _::Debug::Fault::Fault<int,kj::PathPtr&>
                  ((Fault *)&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x302,code,"openat(fd, path, O_RDONLY)","path",&local_40);
        pDVar5 = local_48;
        *(undefined8 *)&local_48->_vptr_Disposer = 0;
        *(undefined8 *)&local_48[1]._vptr_Disposer = 0;
        _::Debug::Fault::~Fault((Fault *)&local_68);
        pRVar4 = extraout_RDX_03;
      }
      MVar7.ptr.ptr = pRVar4;
      MVar7.ptr.disposer = pDVar5;
      return (Maybe<kj::Own<const_kj::ReadableFile,_std::nullptr_t>_>)MVar7.ptr;
    }
  }
  code = 0;
  goto LAB_001f9e94;
}

Assistant:

Maybe<Own<const ReadableFile>> tryOpenFile(PathPtr path) const {
    int newFd;
    KJ_SYSCALL_HANDLE_ERRORS(newFd = openat(
        fd, path.toString().cStr(), O_RDONLY | MAYBE_O_CLOEXEC)) {
      case ENOENT:
      case ENOTDIR:
        return kj::none;
      default:
        KJ_FAIL_SYSCALL("openat(fd, path, O_RDONLY)", error, path) { return kj::none; }
    }

    kj::OwnFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif

    return newDiskReadableFile(kj::mv(result));
  }